

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
* __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::equal_range<int>(pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *__return_storage_ptr__,
                  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,int *key)

{
  pointer psVar1;
  long lVar2;
  const_iterator cVar3;
  const_iterator *pcVar4;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar5;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar6;
  pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *ppVar7;
  byte bVar8;
  const_iterator pos;
  const_iterator startpos;
  const_iterator local_b0;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_68;
  
  bVar8 = 0;
  find<int>(&local_b0,this,key);
  local_68.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.pos.col_current = (const_nonempty_iterator)0x0;
  local_68.end.col_current = (const_nonempty_iterator)0x0;
  local_68.ht = this;
  local_68.pos.row_current._M_current = local_68.pos.row_end._M_current;
  local_68.end.row_begin._M_current = local_68.pos.row_begin._M_current;
  local_68.end.row_end._M_current = local_68.pos.row_end._M_current;
  local_68.end.row_current._M_current = local_68.pos.row_end._M_current;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_68);
  if ((((local_b0.pos.row_begin._M_current == local_68.pos.row_begin._M_current) &&
       (local_b0.pos.row_end._M_current == local_68.pos.row_end._M_current)) &&
      (local_b0.pos.row_current._M_current == local_68.pos.row_current._M_current)) &&
     ((local_b0.pos.row_current._M_current == local_b0.pos.row_end._M_current ||
      (local_b0.pos.col_current == local_68.pos.col_current)))) {
    psVar5 = &local_b0;
    psVar6 = psVar5;
    ppVar7 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (ppVar7->first).ht = psVar6->ht;
      psVar6 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
      ppVar7 = (pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)((long)ppVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    psVar6 = &__return_storage_ptr__->second;
    lVar2 = 9;
  }
  else {
    pcVar4 = &local_b0;
    psVar5 = &local_68;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      psVar5->ht = pcVar4->ht;
      pcVar4 = (const_iterator *)((long)pcVar4 + ((ulong)bVar8 * -2 + 1) * 8);
      psVar5 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    local_b0.pos.col_current = local_b0.pos.col_current + 1;
    cVar3._M_current = local_b0.pos.row_current._M_current;
    if (local_b0.pos.col_current ==
        (local_b0.pos.row_current._M_current)->group +
        ((local_b0.pos.row_current._M_current)->settings).num_buckets) {
      do {
        cVar3._M_current = local_b0.pos.row_current._M_current + 1;
        if (cVar3._M_current == local_b0.pos.row_end._M_current) break;
        local_b0.pos.col_current = (cVar3._M_current)->group;
        psVar1 = local_b0.pos.row_current._M_current + 1;
        local_b0.pos.row_current._M_current = cVar3._M_current;
      } while ((psVar1->settings).num_buckets == 0);
    }
    local_b0.pos.row_current._M_current = cVar3._M_current;
    sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted(&local_b0);
    psVar5 = &local_68;
    ppVar7 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (ppVar7->first).ht = psVar5->ht;
      psVar5 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      ppVar7 = (pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)((long)ppVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    lVar2 = 9;
    psVar5 = &local_b0;
    psVar6 = &__return_storage_ptr__->second;
  }
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    psVar6->ht = psVar5->ht;
    psVar5 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
    psVar6 = (sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, const_iterator> equal_range(
      const K& key) const {
    const_iterator pos = find(key);  // either an iterator or end
    if (pos == end()) {
      return std::pair<const_iterator, const_iterator>(pos, pos);
    } else {
      const const_iterator startpos = pos++;
      return std::pair<const_iterator, const_iterator>(startpos, pos);
    }
  }